

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_true,_true>::append_edge_(DaTrie<false,_true,_true> *this,Query *query)

{
  byte bVar1;
  uint8_t uVar2;
  uint uVar3;
  pointer pBVar4;
  char *pcVar5;
  pointer pNVar6;
  uint32_t node_pos;
  ulong uVar7;
  
  bVar1 = query->key_[query->pos_];
  uVar7 = (ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  if (this->head_pos_ != 0xffffffff) {
    uVar7 = (ulong)this->head_pos_;
  }
  node_pos = (uint32_t)uVar7;
  fix_(this,node_pos,&this->blocks_);
  *(uint32_t *)
   ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
    super__Vector_impl_data._M_start + query->node_pos_) = node_pos & 0x7fffffff ^ (uint)bVar1;
  pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar4[uVar7] =
       (Bc)((ulong)pBVar4[uVar7] & 0x80000000ffffffff |
           (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
  pcVar5 = query->key_;
  uVar3 = query->pos_;
  uVar2 = pcVar5[uVar3];
  pNVar6 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar6[query->node_pos_].child = uVar2;
  pNVar6[uVar7].sib = uVar2;
  query->node_pos_ = node_pos;
  query->pos_ = uVar3 + 1;
  query->is_finished_ = pcVar5[uVar3] == '\0';
  return;
}

Assistant:

void append_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto base = xcheck_(query.label(), blocks_);
    auto child_pos = base ^query.label();

    fix_(child_pos, blocks_);
    bc_[query.node_pos()].set_base(base);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      node_links_[query.node_pos()].child = query.label();
      node_links_[child_pos].sib = query.label();
    }
    query.next(child_pos);
  }